

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_portable_deserialize_frozen(char *buf)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  char *res;
  ulong uVar5;
  roaring_bitmap_t *prVar6;
  long lVar7;
  ushort *puVar8;
  char *res_2;
  ulong uVar9;
  char *pcVar10;
  uint8_t *puVar11;
  long lVar12;
  char *res_1;
  ulong uVar13;
  int32_t *piVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint *puVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  char *pcVar22;
  ushort *local_48;
  char *local_40;
  
  uVar3 = *(uint *)buf;
  if (uVar3 == 0x303a) {
    uVar20 = *(uint *)(buf + 4);
    uVar5 = (ulong)(int)uVar20;
    pcVar21 = buf + 8;
    local_40 = (char *)0x0;
    pcVar22 = buf + uVar5 * 4 + 8;
    local_48 = (ushort *)(pcVar22 + uVar5 * 4);
    if ((long)uVar5 < 1) {
      bVar4 = false;
      lVar7 = 0;
      goto LAB_0010c2bd;
    }
    pcVar10 = buf + 10;
  }
  else {
    if ((uVar3 & 0xffff) != 0x303b) {
      return (roaring_bitmap_t *)0x0;
    }
    local_40 = buf + 4;
    uVar16 = uVar3 >> 0x10;
    uVar20 = uVar16 + 1;
    uVar9 = (ulong)(uVar16 + 8 >> 3);
    pcVar21 = local_40 + uVar9;
    uVar13 = (ulong)(uVar16 * 4 + 4);
    uVar5 = 0;
    pcVar22 = (char *)0x0;
    if (0x2ffff < uVar3) {
      uVar5 = uVar13;
      pcVar22 = pcVar21 + uVar13;
    }
    local_48 = (ushort *)(pcVar21 + uVar13 + uVar5);
    pcVar10 = local_40 + uVar9 + 2;
  }
  uVar5 = (ulong)uVar20;
  uVar13 = 0;
  iVar19 = 0;
  iVar17 = 0;
  iVar15 = 0;
  do {
    if (uVar3 == 0x303a) {
      if (*(ushort *)(pcVar10 + uVar13 * 4) < 0x1000) {
LAB_0010c296:
        iVar15 = iVar15 + 1;
      }
      else {
LAB_0010c287:
        iVar19 = iVar19 + 1;
      }
    }
    else {
      uVar20 = 1 << ((byte)uVar13 & 7) & (uint)(byte)local_40[uVar13 >> 3 & 0x1fffffff];
      if ((uVar20 == 0) && (0xfff < *(ushort *)(pcVar10 + uVar13 * 4))) goto LAB_0010c287;
      if (uVar20 == 0) goto LAB_0010c296;
      iVar17 = iVar17 + 1;
    }
    uVar13 = uVar13 + 1;
  } while (uVar5 != uVar13);
  lVar7 = ((long)iVar15 + (long)iVar17 + (long)iVar19) * 0x10;
  bVar4 = true;
LAB_0010c2bd:
  iVar15 = (int)uVar5;
  lVar12 = (long)iVar15;
  prVar6 = (roaring_bitmap_t *)roaring_malloc(lVar7 + lVar12 * 0xb + 0x28);
  if (prVar6 == (roaring_bitmap_t *)0x0) {
    return (roaring_bitmap_t *)0x0;
  }
  (prVar6->high_low_container).flags = '\x02';
  (prVar6->high_low_container).allocation_size = iVar15;
  (prVar6->high_low_container).size = iVar15;
  piVar14 = &prVar6[1].high_low_container.size + lVar12 * 2;
  (prVar6->high_low_container).containers = (void **)(prVar6 + 1);
  puVar11 = (uint8_t *)((long)piVar14 + lVar12 * 2);
  (prVar6->high_low_container).keys = (uint16_t *)piVar14;
  (prVar6->high_low_container).typecodes = puVar11;
  if (!bVar4) {
    return prVar6;
  }
  puVar18 = (uint *)(puVar11 + lVar12);
  uVar13 = 0;
  do {
    uVar2 = *(ushort *)(pcVar21 + uVar13 * 4 + 2);
    uVar20 = (uint)((ulong)uVar2 + 1);
    puVar8 = local_48;
    if (uVar3 == 0x303a) {
      *(undefined2 *)((long)piVar14 + uVar13 * 2) = *(undefined2 *)(pcVar21 + uVar13 * 4);
      if (uVar2 < 0x1000) {
LAB_0010c3dd:
        puVar11[uVar13] = '\x02';
        *puVar18 = uVar20;
        puVar18[1] = uVar20;
        if (pcVar22 == (char *)0x0) {
          local_48 = local_48 + (ulong)uVar2 + 1;
          goto LAB_0010c423;
        }
      }
      else {
LAB_0010c395:
        puVar11[uVar13] = '\x01';
        *puVar18 = uVar20;
        if (pcVar22 == (char *)0x0) {
          local_48 = local_48 + 0x1000;
          goto LAB_0010c423;
        }
      }
      puVar8 = (ushort *)(buf + *(uint *)(pcVar22 + uVar13 * 4));
    }
    else {
      bVar1 = local_40[uVar13 >> 3 & 0x1fffffff];
      *(undefined2 *)((long)piVar14 + uVar13 * 2) = *(undefined2 *)(pcVar21 + uVar13 * 4);
      uVar16 = 1 << ((byte)uVar13 & 7) & (uint)bVar1;
      if ((uVar16 == 0) && (0xfff < uVar2)) goto LAB_0010c395;
      if (uVar16 == 0) goto LAB_0010c3dd;
      puVar11[uVar13] = '\x03';
      puVar18[1] = uVar20;
      if (pcVar22 == (char *)0x0) {
        uVar2 = *local_48;
        *puVar18 = (uint)uVar2;
        puVar8 = local_48 + 1;
        local_48 = local_48 + (ulong)uVar2 * 2 + 1;
      }
      else {
        *puVar18 = (uint)*(ushort *)(buf + *(uint *)(pcVar22 + uVar13 * 4));
        puVar8 = (ushort *)(buf + (ulong)*(uint *)(pcVar22 + uVar13 * 4) + 2);
      }
    }
LAB_0010c423:
    *(ushort **)(puVar18 + 2) = puVar8;
    (prVar6->high_low_container).containers[uVar13] = puVar18;
    puVar18 = puVar18 + 4;
    uVar13 = uVar13 + 1;
    if ((uVar5 & 0xffffffff) == uVar13) {
      return prVar6;
    }
  } while( true );
}

Assistant:

ALLOW_UNALIGNED
roaring_bitmap_t *roaring_bitmap_portable_deserialize_frozen(const char *buf) {
    char *start_of_buf = (char *)buf;
    uint32_t cookie;
    int32_t num_containers;
    uint16_t *descriptive_headers;
    uint32_t *offset_headers = NULL;
    const char *run_flag_bitset = NULL;
    bool hasrun = false;

    // deserialize cookie
    memcpy(&cookie, buf, sizeof(uint32_t));
    buf += sizeof(uint32_t);
    if (cookie == SERIAL_COOKIE_NO_RUNCONTAINER) {
        memcpy(&num_containers, buf, sizeof(int32_t));
        buf += sizeof(int32_t);
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        offset_headers = (uint32_t *)buf;
        buf += num_containers * sizeof(uint32_t);
    } else if ((cookie & 0xFFFF) == SERIAL_COOKIE) {
        num_containers = (cookie >> 16) + 1;
        hasrun = true;
        int32_t run_flag_bitset_size = (num_containers + 7) / 8;
        run_flag_bitset = buf;
        buf += run_flag_bitset_size;
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        if (num_containers >= NO_OFFSET_THRESHOLD) {
            offset_headers = (uint32_t *)buf;
            buf += num_containers * sizeof(uint32_t);
        }
    } else {
        return NULL;
    }

    // calculate total size for allocation
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        uint32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        if (isbitmap) {
            num_bitset_containers++;
        } else if (isrun) {
            num_run_containers++;
        } else {
            num_array_containers++;
        }
    }

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t *);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);
    alloc_size += num_containers * sizeof(uint16_t);  // keys
    alloc_size += num_containers * sizeof(uint8_t);   // typecodes

    // allocate bitmap and construct containers
    char *arena = (char *)roaring_malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb =
        (roaring_bitmap_t *)arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.containers = (container_t **)arena_alloc(
        &arena, sizeof(container_t *) * num_containers);

    uint16_t *keys =
        (uint16_t *)arena_alloc(&arena, num_containers * sizeof(uint16_t));
    uint8_t *typecodes =
        (uint8_t *)arena_alloc(&arena, num_containers * sizeof(uint8_t));

    rb->high_low_container.keys = keys;
    rb->high_low_container.typecodes = typecodes;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        int32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        keys[i] = descriptive_headers[2 * i];

        if (isbitmap) {
            typecodes[i] = BITSET_CONTAINER_TYPE;
            bitset_container_t *c = (bitset_container_t *)arena_alloc(
                &arena, sizeof(bitset_container_t));
            c->cardinality = cardinality;
            if (offset_headers != NULL) {
                c->words = (uint64_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->words = (uint64_t *)buf;
                buf += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            }
            rb->high_low_container.containers[i] = c;
        } else if (isrun) {
            typecodes[i] = RUN_CONTAINER_TYPE;
            run_container_t *c =
                (run_container_t *)arena_alloc(&arena, sizeof(run_container_t));
            c->capacity = cardinality;
            uint16_t n_runs;
            if (offset_headers != NULL) {
                memcpy(&n_runs, start_of_buf + offset_headers[i],
                       sizeof(uint16_t));
                c->n_runs = n_runs;
                c->runs = (rle16_t *)(start_of_buf + offset_headers[i] +
                                      sizeof(uint16_t));
            } else {
                memcpy(&n_runs, buf, sizeof(uint16_t));
                c->n_runs = n_runs;
                buf += sizeof(uint16_t);
                c->runs = (rle16_t *)buf;
                buf += c->n_runs * sizeof(rle16_t);
            }
            rb->high_low_container.containers[i] = c;
        } else {
            typecodes[i] = ARRAY_CONTAINER_TYPE;
            array_container_t *c = (array_container_t *)arena_alloc(
                &arena, sizeof(array_container_t));
            c->cardinality = cardinality;
            c->capacity = cardinality;
            if (offset_headers != NULL) {
                c->array = (uint16_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->array = (uint16_t *)buf;
                buf += cardinality * sizeof(uint16_t);
            }
            rb->high_low_container.containers[i] = c;
        }
    }

    return rb;
}